

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_journal_rollback(Pager *pPager,int check_hot)

{
  int iVar1;
  int local_24;
  int local_20;
  int iExists;
  int rc;
  int check_hot_local;
  Pager *pPager_local;
  
  iExists = check_hot;
  _rc = pPager;
  if (check_hot != 0) {
    local_24 = 0;
    iVar1 = pager_has_hot_journal(pPager,&local_24);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (local_24 == 0) {
      return 0;
    }
    local_20 = 0;
  }
  if (_rc->is_rdonly == 0) {
    local_20 = unqliteOsOpen(_rc->pVfs,_rc->pAllocator,_rc->zJournal,&_rc->pjfd,2);
    if (local_20 == 0) {
      local_20 = pager_lock_db(_rc,4);
      if (local_20 == 0) {
        unqliteOsSync(_rc->pjfd,2);
        local_20 = pager_playback(_rc);
        pager_unlock_db(_rc,1);
      }
      else {
        unqliteGenError(_rc->pDb,
                        "Cannot acquire an exclusive lock on the database while journal rollback");
      }
    }
    else {
      unqliteGenErrorFormat(_rc->pDb,"IO error while opening journal file: \'%s\'",_rc->zJournal);
    }
    unqliteOsCloseFree(_rc->pAllocator,_rc->pjfd);
    _rc->pjfd = (unqlite_file *)0x0;
    if (local_20 == 0) {
      unqliteOsDelete(_rc->pVfs,_rc->zJournal,1);
    }
    pPager_local._4_4_ = local_20;
  }
  else {
    unqliteGenErrorFormat
              (_rc->pDb,"Cannot rollback journal file \'%s\' due to a read-only database handle",
               _rc->zJournal);
    pPager_local._4_4_ = -0x4b;
  }
  return pPager_local._4_4_;
}

Assistant:

static int pager_journal_rollback(Pager *pPager,int check_hot)
{
	int rc;
	if( check_hot ){
		int iExists = 0; /* cc warning */
		/* Check if the journal file exists */
		rc = pager_has_hot_journal(pPager,&iExists);
		if( rc != UNQLITE_OK  ){
			/* IO error */
			return rc;
		}
		if( !iExists ){
			/* Journal file does not exists */
			return UNQLITE_OK;
		}
	}
	if( pPager->is_rdonly ){
		unqliteGenErrorFormat(pPager->pDb,
			"Cannot rollback journal file '%s' due to a read-only database handle",pPager->zJournal);
		return UNQLITE_READ_ONLY;
	}
	/* Get an EXCLUSIVE lock on the database file. At this point it is
      ** important that a RESERVED lock is not obtained on the way to the
      ** EXCLUSIVE lock. If it were, another process might open the
      ** database file, detect the RESERVED lock, and conclude that the
      ** database is safe to read while this process is still rolling the 
      ** hot-journal back.
      ** 
      ** Because the intermediate RESERVED lock is not requested, any
      ** other process attempting to access the database file will get to 
      ** this point in the code and fail to obtain its own EXCLUSIVE lock 
      ** on the database file.
      **
      ** Unless the pager is in locking_mode=exclusive mode, the lock is
      ** downgraded to SHARED_LOCK before this function returns.
      */
	/* Open the journal file */
	rc = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zJournal,&pPager->pjfd,UNQLITE_OPEN_READWRITE);
	if( rc != UNQLITE_OK ){
		unqliteGenErrorFormat(pPager->pDb,"IO error while opening journal file: '%s'",pPager->zJournal);
		goto fail;
	}
	rc = pager_lock_db(pPager,EXCLUSIVE_LOCK);
	if( rc != UNQLITE_OK ){
		unqliteGenError(pPager->pDb,"Cannot acquire an exclusive lock on the database while journal rollback");
		goto fail;
	}
	/* Sync the journal file */
	unqliteOsSync(pPager->pjfd,UNQLITE_SYNC_NORMAL);
	/* Finally rollback the database */
	rc = pager_playback(pPager);
	/* Switch back to shared lock */
	pager_unlock_db(pPager,SHARED_LOCK);
fail:
	/* Close the journal handle */
	unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
	pPager->pjfd = 0;
	if( rc == UNQLITE_OK ){
		/* Delete the journal file */
		unqliteOsDelete(pPager->pVfs,pPager->zJournal,TRUE);
	}
	return rc;
}